

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int txfm_partition_context
              (TXFM_CONTEXT *above_ctx,TXFM_CONTEXT *left_ctx,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  byte in_CL;
  byte in_DL;
  byte *in_RSI;
  byte *in_RDI;
  TX_SIZE max_tx_size;
  int category;
  int left;
  int above;
  uint8_t txh;
  uint8_t txw;
  bool local_31;
  uint local_30;
  int local_28;
  int local_4;
  
  iVar3 = tx_size_wide[in_CL];
  iVar4 = tx_size_high[in_CL];
  bVar1 = *in_RDI;
  bVar2 = *in_RSI;
  local_28 = 0x15;
  if (in_CL == 0) {
    local_4 = 0;
  }
  else {
    if (block_size_high[in_DL] < block_size_wide[in_DL]) {
      bVar5 = block_size_wide[in_DL];
    }
    else {
      bVar5 = block_size_high[in_DL];
    }
    local_30 = (uint)bVar5;
    bVar5 = get_sqr_tx_size(local_30);
    if (bVar5 != 0) {
      local_31 = ""[in_CL] != bVar5 && 1 < bVar5;
      local_28 = (uint)local_31 + (4 - (uint)bVar5) * 2;
    }
    local_4 = local_28 * 3 + (uint)(bVar1 < (byte)iVar3) + (uint)(bVar2 < (byte)iVar4);
  }
  return local_4;
}

Assistant:

static inline int txfm_partition_context(const TXFM_CONTEXT *const above_ctx,
                                         const TXFM_CONTEXT *const left_ctx,
                                         BLOCK_SIZE bsize, TX_SIZE tx_size) {
  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  const int above = *above_ctx < txw;
  const int left = *left_ctx < txh;
  int category = TXFM_PARTITION_CONTEXTS;

  // dummy return, not used by others.
  if (tx_size <= TX_4X4) return 0;

  TX_SIZE max_tx_size =
      get_sqr_tx_size(AOMMAX(block_size_wide[bsize], block_size_high[bsize]));

  if (max_tx_size >= TX_8X8) {
    category =
        (txsize_sqr_up_map[tx_size] != max_tx_size && max_tx_size > TX_8X8) +
        (TX_SIZES - 1 - max_tx_size) * 2;
  }
  assert(category != TXFM_PARTITION_CONTEXTS);
  return category * 3 + above + left;
}